

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O2

void __thiscall
Refal2::CInternalProgramBuilder::linkFunction
          (CInternalProgramBuilder *this,CPreparatoryFunction *function,
          TRuntimeModuleId runtimeModuleId)

{
  TPreparatoryFunctionType TVar1;
  int iVar2;
  CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  __shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> *this_01;
  string *key;
  CGlobalFunctionData *program;
  COrdinaryFunction *this_02;
  TOperationAddress _firstOperation;
  __shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  this_00 = &CProgram::Module((this->program).
                              super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,runtimeModuleId)->Functions;
  iVar2 = CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::AddKey(this_00,&function->name);
  this_01 = &CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::GetData(this_00,iVar2)->
             super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>;
  if (this_01->_M_ptr != (element_type *)0x0) {
    __assert_fail("!static_cast<bool>( runtimeFunction )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                  ,0x14d,
                  "void Refal2::CInternalProgramBuilder::linkFunction(CPreparatoryFunction *, const TRuntimeModuleId)"
                 );
  }
  TVar1 = function->type;
  if (TVar1 != PFT_Compiled) {
    if (TVar1 == PFT_External) {
      key = CPreparatoryFunction::ExternalName_abi_cxx11_(function);
      iVar2 = CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::FindKey(&this->globals,key);
      if (iVar2 == -1) {
        __assert_fail("globalIndex != InvalidDictionaryIndex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                      ,0x15a,
                      "void Refal2::CInternalProgramBuilder::linkFunction(CPreparatoryFunction *, const TRuntimeModuleId)"
                     );
      }
      program = CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::GetData(&this->globals,iVar2);
      CGlobalFunctionData::RuntimeFunction((CGlobalFunctionData *)&_Stack_38,(CProgramPtr *)program)
      ;
    }
    else {
      if (TVar1 != PFT_Empty) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                      ,0x160,
                      "void Refal2::CInternalProgramBuilder::linkFunction(CPreparatoryFunction *, const TRuntimeModuleId)"
                     );
      }
      std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&_Stack_38,
                 &(((this->program).super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->emptyFunction).
                  super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>);
    }
    std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_01,&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
    return;
  }
  this_02 = (COrdinaryFunction *)operator_new(0x18);
  _firstOperation = CPreparatoryFunction::FirstOperation(function);
  COrdinaryFunction::COrdinaryFunction(this_02,_firstOperation,runtimeModuleId);
  std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::
  reset<Refal2::COrdinaryFunction>(this_01,this_02);
  return;
}

Assistant:

void CInternalProgramBuilder::linkFunction( CPreparatoryFunction* function,
	const TRuntimeModuleId runtimeModuleId )
{
	CRuntimeFunctions& functions = program->Module( runtimeModuleId ).Functions;
	const int functionKey = functions.AddKey( function->Name() );
	CRuntimeFunctionPtr& runtimeFunction = functions.GetData( functionKey );
	assert( !static_cast<bool>( runtimeFunction ) );

	switch( function->GetType() ) {
		case PFT_Empty:
			runtimeFunction = program->EmptyFunction();
			break;
		case PFT_Compiled:
			runtimeFunction.reset( new COrdinaryFunction(
				function->FirstOperation(), runtimeModuleId ) );
			break;
		case PFT_External:
		{
			const int globalIndex = globals.FindKey( function->ExternalName() );
			assert( globalIndex != InvalidDictionaryIndex );
			const CGlobalFunctionData& global = globals.GetData( globalIndex );
			runtimeFunction = global.RuntimeFunction( program );
			break;
		}
		default:
			assert( false );
			break;
	}
}